

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O3

int Wla_ManShrinkAbs(Wla_Man_t *pWla,int nFrames,int RunId)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  int *piVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  Vec_Int_t *vBlacks;
  Vec_Int_t *vPPIs;
  ulong uVar9;
  Wlc_Ntk_t *pWVar10;
  Gia_Man_t *p;
  Gia_Man_t *p_00;
  size_t sVar11;
  char *pcVar12;
  ulong uVar13;
  Gia_Obj_t *pGVar14;
  Gia_Man_t *pFrames;
  Vec_Int_t *pVVar15;
  int *piVar16;
  Vec_Int_t *pVVar17;
  int iVar18;
  char *pcVar19;
  int iVar20;
  long lVar21;
  uint uVar22;
  long lVar23;
  char *__assertion;
  ulong uVar24;
  int iVar25;
  uint uVar26;
  Gia_Obj_t *in_R9;
  long lVar27;
  long lVar28;
  timespec ts;
  Wlc_Par_t *in_stack_ffffffffffffff68;
  long local_60;
  timespec local_58;
  Wla_Man_t *local_48;
  Wlc_Ntk_t *local_40;
  long local_38;
  
  vBlacks = Wla_ManCollectNodes(pWla,0);
  vPPIs = Wla_ManCollectNodes(pWla,1);
  pWVar10 = pWla->p;
  local_48 = pWla;
  iVar7 = clock_gettime(3,&local_58);
  if (iVar7 < 0) {
    local_60 = 1;
  }
  else {
    lVar21 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_58.tv_nsec),8);
    local_60 = ((lVar21 >> 7) - (lVar21 >> 0x3f)) + local_58.tv_sec * -1000000;
  }
  if ((vBlacks == (Vec_Int_t *)0x0) || (uVar9 = (ulong)(uint)vBlacks->nSize, uVar9 == 0)) {
    __assert_fail("vWhites && Vec_IntSize(vWhites)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcAbs.c"
                  ,0x2b4,
                  "Vec_Bit_t *Wlc_NtkProofReduce(Wlc_Ntk_t *, Wlc_Par_t *, int, Vec_Int_t *, Vec_Int_t *, int)"
                 );
  }
  pWVar10 = Wlc_NtkIntroduceChoices(pWVar10,vBlacks,vPPIs);
  iVar7 = Wlc_NtkNumPiBits(pWVar10);
  pcVar12 = (char *)0x0;
  local_40 = pWVar10;
  p = Wlc_NtkBitBlast(pWVar10,(Wlc_BstPar_t *)0x0);
  p_00 = Gia_ManStart(10000);
  pcVar19 = p->pName;
  if (pcVar19 != (char *)0x0) {
    sVar11 = strlen(pcVar19);
    pcVar12 = (char *)malloc(sVar11 + 1);
    strcpy(pcVar12,pcVar19);
  }
  p_00->pName = pcVar12;
  Gia_ManHashAlloc(p_00);
  pGVar4 = p->pObjs;
  pGVar4->Value = 0;
  uVar13 = (ulong)p->nRegs;
  if (0 < (long)uVar13) {
    pVVar15 = p->vCos;
    iVar18 = pVVar15->nSize;
    uVar22 = iVar18 - p->nRegs;
    uVar24 = uVar13;
    do {
      if (((int)uVar22 < 0) || (iVar18 <= (int)uVar22)) {
LAB_00892e0f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar8 = pVVar15->pArray[uVar22];
      lVar21 = (long)iVar8;
      if ((lVar21 < 0) || (p->nObjs <= iVar8)) {
LAB_00892dd1:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      in_R9 = (Gia_Obj_t *)(lVar21 * 3);
      pGVar4[lVar21].Value = 0;
      uVar22 = uVar22 + 1;
      uVar24 = uVar24 - 1;
    } while (uVar24 != 0);
  }
  iVar8 = (int)in_R9;
  iVar18 = iVar7 - (int)uVar9;
  if (0 < nFrames) {
    local_38 = (long)iVar7;
    lVar21 = (long)iVar18;
    iVar7 = 0;
    do {
      pVVar15 = p->vCis;
      iVar8 = pVVar15->nSize;
      uVar22 = (uint)uVar13;
      iVar20 = iVar8 - uVar22;
      if (iVar20 != 0 && (int)uVar22 <= iVar8) {
        lVar28 = 0;
        do {
          if ((lVar28 < local_38 && lVar21 <= lVar28) && (iVar7 != 0)) {
            iVar20 = iVar8 - (int)uVar13;
            lVar23 = (long)iVar20;
          }
          else {
            pGVar14 = Gia_ManAppendObj(p_00);
            uVar13 = *(ulong *)pGVar14;
            *(ulong *)pGVar14 = uVar13 | 0x9fffffff;
            *(ulong *)pGVar14 =
                 uVar13 & 0xe0000000ffffffff | 0x9fffffff |
                 (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
            pGVar4 = p_00->pObjs;
            if ((pGVar14 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar14)) {
LAB_00892df0:
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
            Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar14 - (long)pGVar4) >> 2) * -0x55555555);
            pGVar4 = p_00->pObjs;
            if ((pGVar14 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar14)) goto LAB_00892df0;
            uVar13 = (ulong)(uint)p->nRegs;
            pVVar15 = p->vCis;
            iVar8 = pVVar15->nSize;
            iVar20 = iVar8 - p->nRegs;
            lVar23 = (long)iVar20;
            if (lVar23 <= lVar28) {
              __assert_fail("v < Gia_ManPiNum(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d4,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
            }
            if (iVar8 <= lVar28) goto LAB_00892e0f;
            lVar27 = (long)pVVar15->pArray[lVar28];
            if ((lVar27 < 0) || (p->nObjs <= pVVar15->pArray[lVar28])) goto LAB_00892dd1;
            in_R9 = (Gia_Obj_t *)(lVar27 * 3);
            p->pObjs[lVar27].Value = (int)((ulong)((long)pGVar14 - (long)pGVar4) >> 2) * 0x55555556;
          }
          uVar22 = (uint)uVar13;
          lVar28 = lVar28 + 1;
        } while (lVar28 < lVar23);
      }
      if ((int)uVar22 < 1) {
        uVar22 = p->nObjs;
        if (0 < (int)uVar22) goto LAB_0089295e;
      }
      else {
        pVVar17 = p->vCos;
        iVar2 = pVVar17->nSize;
        in_R9 = (Gia_Obj_t *)(ulong)(iVar2 - uVar22);
        lVar28 = (long)iVar20;
        uVar13 = (ulong)uVar22;
        do {
          iVar25 = (int)in_R9;
          if ((iVar25 < 0) || (iVar2 <= iVar25)) goto LAB_00892e0f;
          iVar3 = pVVar17->pArray[(long)in_R9];
          if (((long)iVar3 < 0) || (uVar22 = p->nObjs, (int)uVar22 <= iVar3)) goto LAB_00892dd1;
          pGVar4 = p->pObjs;
          if (pGVar4 == (Gia_Obj_t *)0x0) break;
          if ((iVar20 < 0) || (iVar8 <= lVar28)) goto LAB_00892e0f;
          uVar26 = pVVar15->pArray[lVar28];
          if (((long)(int)uVar26 < 0) || (uVar22 <= uVar26)) goto LAB_00892dd1;
          pGVar4[(int)uVar26].Value = pGVar4[iVar3].Value;
          lVar28 = lVar28 + 1;
          in_R9 = (Gia_Obj_t *)(ulong)(iVar25 + 1);
          uVar13 = uVar13 - 1;
        } while (uVar13 != 0);
LAB_0089295e:
        lVar28 = 8;
        lVar23 = 0;
        do {
          pGVar4 = p->pObjs;
          if (pGVar4 == (Gia_Obj_t *)0x0) break;
          uVar13 = *(ulong *)((long)pGVar4 + lVar28 + -8);
          if ((uVar13 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar13) {
            uVar22 = *(uint *)((long)pGVar4 +
                              lVar28 + (ulong)(uint)((int)(uVar13 & 0x1fffffff) << 2) * -3);
            if (((int)uVar22 < 0) ||
               (uVar26 = *(uint *)((long)pGVar4 +
                                  lVar28 + (ulong)((uint)(uVar13 >> 0x1e) & 0x7ffffffc) * -3),
               (int)uVar26 < 0)) goto LAB_00892e2e;
            iVar8 = Gia_ManHashAnd(p_00,uVar22 ^ (uint)(uVar13 >> 0x1d) & 1,
                                   uVar26 ^ (uint)(uVar13 >> 0x3d) & 1);
            *(int *)(&pGVar4->field_0x0 + lVar28) = iVar8;
            uVar22 = p->nObjs;
          }
          lVar23 = lVar23 + 1;
          lVar28 = lVar28 + 0xc;
        } while (lVar23 < (int)uVar22);
      }
      pVVar15 = p->vCos;
      iVar8 = pVVar15->nSize;
      uVar24 = (ulong)iVar8;
      if (0 < (long)uVar24) {
        piVar16 = pVVar15->pArray;
        uVar13 = 0;
        do {
          iVar20 = piVar16[uVar13];
          if (((long)iVar20 < 0) || ((int)uVar22 <= iVar20)) goto LAB_00892dd1;
          in_R9 = p->pObjs;
          if (in_R9 == (Gia_Obj_t *)0x0) break;
          pGVar4 = in_R9 + iVar20;
          if ((int)pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value < 0)
          goto LAB_00892e2e;
          uVar26 = (uint)*(undefined8 *)pGVar4 >> 0x1d & 1 ^
                   pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value;
          in_R9 = (Gia_Obj_t *)(ulong)uVar26;
          pGVar4->Value = uVar26;
          uVar13 = uVar13 + 1;
        } while (uVar24 != uVar13);
      }
      uVar13 = (ulong)(uint)p->nRegs;
      if (p->nRegs < iVar8) {
        lVar28 = 0;
        do {
          if ((int)uVar24 <= lVar28) goto LAB_00892e0f;
          iVar8 = pVVar15->pArray[lVar28];
          if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) goto LAB_00892dd1;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          Gia_ManAppendCo(p_00,p->pObjs[iVar8].Value);
          lVar28 = lVar28 + 1;
          uVar13 = (ulong)(uint)p->nRegs;
          pVVar15 = p->vCos;
          uVar24 = (ulong)(uint)pVVar15->nSize;
        } while (lVar28 < pVVar15->nSize - p->nRegs);
      }
      iVar8 = (int)in_R9;
      iVar7 = iVar7 + 1;
    } while (iVar7 != nFrames);
  }
  Gia_ManHashStop(p_00);
  sVar11 = 0;
  Gia_ManSetRegNum(p_00,0);
  pFrames = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  Gia_ManStop(p);
  iVar7 = (((int)uVar9 >> 5) + 1) - (uint)((uVar9 & 0x1f) == 0);
  pVVar15 = (Vec_Int_t *)malloc(0x10);
  uVar22 = iVar7 * 0x20;
  pVVar15->nCap = uVar22;
  if (iVar7 == 0) {
    piVar16 = (int *)0x0;
  }
  else {
    sVar11 = (long)iVar7 << 2;
    piVar16 = (int *)malloc(sVar11);
  }
  pVVar15->pArray = piVar16;
  pVVar15->nSize = uVar22;
  memset(piVar16,0xff,sVar11);
  pVVar17 = Wlc_NtkGetCoreSels(pFrames,iVar18,(int)uVar9,(int)pVVar15,
                               (Vec_Bit_t *)(ulong)(uint)RunId,iVar8,in_stack_ffffffffffffff68,
                               (int)uVar9,iVar18);
  Wlc_NtkFree(local_40);
  Gia_ManStop(pFrames);
  if (pVVar17 == (Vec_Int_t *)0x0) {
    if (vBlacks->pArray != (int *)0x0) {
      free(vBlacks->pArray);
    }
    free(vBlacks);
    piVar16 = vPPIs->pArray;
    uVar22 = 0xffffffff;
    goto LAB_00892daa;
  }
  if (0 < iVar7) {
    memset(piVar16,0,(ulong)(iVar7 - 1) * 4 + 4);
  }
  iVar7 = pVVar17->nSize;
  if (0 < (long)iVar7) {
    piVar5 = pVVar17->pArray;
    lVar21 = 0;
    do {
      uVar26 = piVar5[lVar21];
      if (((int)uVar26 < 0) || ((int)uVar22 <= (int)uVar26)) goto LAB_00892e6c;
      piVar16[uVar26 >> 5] = piVar16[uVar26 >> 5] | 1 << ((byte)uVar26 & 0x1f);
      lVar21 = lVar21 + 1;
    } while (iVar7 != lVar21);
  }
  uVar26 = uVar22;
  iVar7 = Vec_BitCount((Vec_Bit_t *)(ulong)uVar22);
  Abc_Print(uVar26,"ProofReduce: remove %d out of %d white boxes.",(ulong)(uint)((int)uVar9 - iVar7)
           );
  iVar18 = 3;
  iVar7 = clock_gettime(3,&local_58);
  if (iVar7 < 0) {
    lVar21 = -1;
  }
  else {
    lVar21 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
  }
  Abc_Print(iVar18,"%s ="," Time");
  Abc_Print(iVar18,"%9.2f sec\n",(double)(lVar21 + local_60) / 1000000.0);
  if (pVVar17->pArray != (int *)0x0) {
    free(pVVar17->pArray);
  }
  free(pVVar17);
  iVar7 = Vec_BitCount((Vec_Bit_t *)(ulong)uVar22);
  piVar5 = vBlacks->pArray;
  if ((int)uVar9 < 1) {
    if (piVar5 != (int *)0x0) goto LAB_00892d81;
  }
  else {
    uVar13 = 0;
    do {
      if (uVar22 == uVar13) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                      ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
      }
      if (((uint)piVar16[uVar13 >> 5 & 0x7ffffff] >> ((uint)uVar13 & 0x1f) & 1) == 0) {
        uVar26 = piVar5[uVar13];
        if (((int)uVar26 < 0) || (local_48->vUnmark->nSize <= (int)uVar26)) goto LAB_00892e6c;
        bVar6 = (byte)uVar26 & 0x1f;
        puVar1 = (uint *)(local_48->vUnmark->pArray + (uVar26 >> 5));
        *puVar1 = *puVar1 & (-2 << bVar6 | 0xfffffffeU >> 0x20 - bVar6);
      }
      uVar13 = uVar13 + 1;
    } while (uVar9 != uVar13);
LAB_00892d81:
    free(piVar5);
  }
  free(vBlacks);
  if (vPPIs->pArray != (int *)0x0) {
    free(vPPIs->pArray);
  }
  uVar22 = (uint)((int)uVar9 != iVar7);
  free(vPPIs);
  vPPIs = pVVar15;
LAB_00892daa:
  if (piVar16 != (int *)0x0) {
    free(piVar16);
  }
  free(vPPIs);
  return uVar22;
LAB_00892e2e:
  __assertion = "Lit >= 0";
  pcVar12 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h";
  pcVar19 = "int Abc_LitNotCond(int, int)";
  goto LAB_00892e43;
LAB_00892e6c:
  __assertion = "i >= 0 && i < p->nSize";
  pcVar12 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h";
  pcVar19 = "void Vec_BitWriteEntry(Vec_Bit_t *, int, int)";
LAB_00892e43:
  __assert_fail(__assertion,pcVar12,0x132,pcVar19);
}

Assistant:

int Wla_ManShrinkAbs( Wla_Man_t * pWla, int nFrames, int RunId )
{
    int i, Entry;
    int RetValue = 0;

    Vec_Int_t * vWhites = Wla_ManCollectNodes( pWla, 0 );
    Vec_Int_t * vBlacks = Wla_ManCollectNodes( pWla, 1 );
    Vec_Bit_t * vCoreMarks = Wlc_NtkProofReduce( pWla->p, pWla->pPars, nFrames, vWhites, vBlacks, RunId );

    if ( vCoreMarks == NULL )
    {
        Vec_IntFree( vWhites );
        Vec_IntFree( vBlacks );
        return -1;
    }

    RetValue = Vec_IntSize( vWhites ) != Vec_BitCount( vCoreMarks );

    Vec_IntForEachEntry( vWhites, Entry, i )
        if ( !Vec_BitEntry( vCoreMarks, i ) )
            Vec_BitWriteEntry( pWla->vUnmark, Entry, 0 );

    Vec_IntFree( vWhites );
    Vec_IntFree( vBlacks );
    Vec_BitFree( vCoreMarks );

    return RetValue;
}